

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O2

bool __thiscall
cmSeparateArgumentsCommand::InitialPass
          (cmSeparateArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  pointer pbVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  int iVar6;
  bool bVar7;
  pointer pbVar8;
  char cVar9;
  int iVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string var;
  string command;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 == pbVar2) {
    std::__cxx11::string::string
              ((string *)&e,"must be given at least one argument.",(allocator *)&var);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    bVar7 = false;
  }
  else {
    var._M_dataplus._M_p = (pointer)&var.field_2;
    var._M_string_length = 0;
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    iVar10 = 0;
    var.field_2._M_local_buf[0] = '\0';
    command.field_2._M_local_buf[0] = '\0';
    iVar6 = 1;
    uVar12 = 0;
    while( true ) {
      uVar13 = (ulong)uVar12;
      uVar3 = (long)pbVar2 - (long)pbVar8 >> 5;
      bVar7 = uVar3 <= uVar13;
      if (uVar3 <= uVar13) break;
      if (iVar6 == 3) {
        iVar6 = 0;
        std::__cxx11::string::_M_assign((string *)&command);
      }
      else if (iVar6 == 2) {
        bVar1 = std::operator==(pbVar8 + uVar13,"UNIX_COMMAND");
        iVar10 = 1;
        iVar6 = 3;
        if (!bVar1) {
          bVar1 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar13,
                                  "WINDOWS_COMMAND");
          iVar10 = 2;
          iVar6 = 3;
          if (!bVar1) goto LAB_002db4d5;
        }
      }
      else {
        if (iVar6 != 1) {
LAB_002db4d5:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar4 = std::operator<<((ostream *)&e,"given unknown argument ");
          std::operator<<(poVar4,(string *)
                                 ((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar13));
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&vec);
          std::__cxx11::string::~string((string *)&vec);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          goto LAB_002db65d;
        }
        std::__cxx11::string::_M_assign((string *)&var);
        iVar6 = 2;
      }
      uVar12 = uVar12 + 1;
      pbVar8 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (iVar10 == 0) {
      pcVar5 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&var);
      if (pcVar5 != (char *)0x0) {
        std::__cxx11::string::string((string *)&e,pcVar5,(allocator *)&vec);
        cmsys::SystemTools::ReplaceString((string *)&e," ",";");
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&var,_e);
        std::__cxx11::string::~string((string *)&e);
      }
    }
    else {
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (iVar10 == 1) {
        cmSystemTools::ParseUnixCommandLine(command._M_dataplus._M_p,&vec);
      }
      else {
        cmSystemTools::ParseWindowsCommandLine(command._M_dataplus._M_p,&vec);
      }
      _e = (pointer)local_198;
      local_198[0]._M_local_buf[0] = '\0';
      for (pbVar8 = vec.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar8 != vec.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        std::__cxx11::string::append((char *)&e);
        pcVar5 = (pbVar8->_M_dataplus)._M_p;
        for (pcVar11 = pcVar5; pcVar11 != pcVar5 + pbVar8->_M_string_length; pcVar11 = pcVar11 + 1)
        {
          cVar9 = (char)&e;
          if (*pcVar11 == ';') {
            std::__cxx11::string::push_back(cVar9);
          }
          std::__cxx11::string::push_back(cVar9);
          pcVar5 = (pbVar8->_M_dataplus)._M_p;
        }
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&var,_e);
      std::__cxx11::string::~string((string *)&e);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vec);
    }
LAB_002db65d:
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::string::~string((string *)&var);
  }
  return bVar7;
}

Assistant:

bool cmSeparateArgumentsCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.empty())
    {
    this->SetError("must be given at least one argument.");
    return false;
    }

  std::string var;
  std::string command;
  enum Mode { ModeOld, ModeUnix, ModeWindows };
  Mode mode = ModeOld;
  enum Doing { DoingNone, DoingVariable, DoingMode, DoingCommand };
  Doing doing = DoingVariable;
  for(unsigned int i=0; i < args.size(); ++i)
    {
    if(doing == DoingVariable)
      {
      var = args[i];
      doing = DoingMode;
      }
    else if(doing == DoingMode && args[i] == "UNIX_COMMAND")
      {
      mode = ModeUnix;
      doing = DoingCommand;
      }
    else if(doing == DoingMode && args[i] == "WINDOWS_COMMAND")
      {
      mode = ModeWindows;
      doing = DoingCommand;
      }
    else if(doing == DoingCommand)
      {
      command = args[i];
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
      }
    }

  if(mode == ModeOld)
    {
    // Original space-replacement version of command.
    if(const char* def = this->Makefile->GetDefinition(var))
      {
      std::string value = def;
      cmSystemTools::ReplaceString(value, " ", ";");
      this->Makefile->AddDefinition(var, value.c_str());
      }
    }
  else
    {
    // Parse the command line.
    std::vector<std::string> vec;
    if(mode == ModeUnix)
      {
      cmSystemTools::ParseUnixCommandLine(command.c_str(), vec);
      }
    else // if(mode == ModeWindows)
      {
      cmSystemTools::ParseWindowsCommandLine(command.c_str(), vec);
      }

    // Construct the result list value.
    std::string value;
    const char* sep = "";
    for(std::vector<std::string>::const_iterator vi = vec.begin();
        vi != vec.end(); ++vi)
      {
      // Separate from the previous argument.
      value += sep;
      sep = ";";

      // Preserve semicolons.
      for(std::string::const_iterator si = vi->begin();
          si != vi->end(); ++si)
        {
        if(*si == ';')
          {
          value += '\\';
          }
        value += *si;
        }
      }
    this->Makefile->AddDefinition(var, value.c_str());
    }

  return true;
}